

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O0

HighsStatus __thiscall
HighsIis::compute(HighsIis *this,HighsLp *lp,HighsOptions *options,HighsBasis *basis)

{
  bool bVar1;
  uint uVar2;
  HighsStatus HVar3;
  int iVar4;
  reference pvVar5;
  const_reference pvVar6;
  HighsModelStatus *pHVar7;
  HighsIis *this_00;
  undefined8 uVar8;
  const_reference pvVar9;
  string *in_RCX;
  long in_RDX;
  int *in_RSI;
  undefined1 *in_RDI;
  bool bVar10;
  HighsInt iRow_1;
  HighsInt iss_num_row;
  HighsInt iCol_2;
  HighsInt iss_num_col;
  HighsInt iEl;
  bool empty_col;
  HighsInt iCol_1;
  HighsInt iss_bound_status;
  HighsInt check_num_nz;
  HighsInt check_num_ix;
  double check_cost;
  double check_upper;
  double check_lower;
  bool debug_bound_change;
  HighsModelStatus model_status_1;
  bool apply_reciprocal_rule;
  HighsModelStatus model_status;
  bool drop_lower_1;
  double upper;
  double lower;
  HighsInt ix_status;
  HighsInt num_index;
  string type;
  HighsInt k;
  anon_class_96_12_a4261637 solveLp;
  bool drop_lower;
  HighsInt iX;
  bool row_deletion;
  vector<double,_std::allocator<double>_> primal_phase1_dual;
  bool use_sensitivity_filter;
  vector<double,_std::allocator<double>_> cost;
  HighsStatus run_status;
  HighsSolution *solution;
  HighsBasis *incumbent_basis;
  HighsLp *incumbent_lp;
  HighsInfo *info;
  Highs highs;
  HighsInt iRow;
  HighsInt iCol;
  bool row_priority;
  HighsLogOptions *log_options;
  undefined1 *in_stack_ffffffffffffa688;
  Highs *in_stack_ffffffffffffa690;
  Highs *in_stack_ffffffffffffa698;
  HighsInt HVar11;
  Highs *in_stack_ffffffffffffa6a0;
  anon_class_96_12_a4261637 *in_stack_ffffffffffffa6a8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffa6b0;
  HighsLogOptions *log_options_;
  HighsStatus local_58fc;
  undefined4 in_stack_ffffffffffffa708;
  undefined4 in_stack_ffffffffffffa70c;
  undefined4 in_stack_ffffffffffffa710;
  undefined4 in_stack_ffffffffffffa714;
  double *in_stack_ffffffffffffa718;
  HighsStatus in_stack_ffffffffffffa720;
  HighsStatus in_stack_ffffffffffffa724;
  HighsStatus in_stack_ffffffffffffa728;
  HighsStatus in_stack_ffffffffffffa72c;
  HighsStatus in_stack_ffffffffffffa730;
  HighsStatus in_stack_ffffffffffffa734;
  HighsStatus in_stack_ffffffffffffa738;
  HighsStatus in_stack_ffffffffffffa73c;
  HighsStatus in_stack_ffffffffffffa740;
  HighsStatus in_stack_ffffffffffffa744;
  Highs *in_stack_ffffffffffffa748;
  HighsStatus in_stack_ffffffffffffa750;
  HighsStatus in_stack_ffffffffffffa754;
  HighsStatus in_stack_ffffffffffffa758;
  HighsStatus in_stack_ffffffffffffa75c;
  double *upper_00;
  double *value;
  value_type vVar12;
  allocator *paVar13;
  HighsInt *local_5878;
  bool local_586a;
  bool local_5869;
  double *in_stack_ffffffffffffa7a8;
  undefined8 in_stack_ffffffffffffa7b0;
  undefined4 in_stack_ffffffffffffa7bc;
  string *in_stack_ffffffffffffa7c8;
  HighsBasis *in_stack_ffffffffffffa7d0;
  undefined4 in_stack_ffffffffffffa7d8;
  int local_57dc;
  int local_57d8;
  int local_57d4;
  int local_57d0;
  int local_57cc;
  uint local_57c4;
  string local_57c0 [36];
  value_type local_579c;
  undefined1 local_5798 [16];
  undefined1 local_5788 [23];
  undefined1 local_5771;
  HighsModelStatus local_5770;
  undefined1 local_5769;
  HighsModelStatus local_5768;
  undefined1 local_5761;
  double *local_5760;
  double *local_5758;
  int local_574c;
  int local_5748;
  allocator local_5741;
  string local_5740 [32];
  int local_5720;
  int local_571c;
  undefined1 *local_5718;
  HighsInfo *local_5710;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_5708;
  pointer local_56f8;
  HighsBasisStatus *local_56f0;
  HighsSolution *local_56e0;
  HighsBasisStatus *local_56d0;
  HighsBasis *local_56c8;
  HighsBasisStatus local_56b1;
  uint local_56b0;
  bool local_56a9;
  HighsBasisStatus local_56a8 [30];
  undefined1 local_568a;
  allocator local_5689;
  string local_5688 [32];
  double local_5668;
  HighsBasis local_5641 [7];
  HighsStatus local_5284;
  HighsSolution *local_5280;
  HighsBasis *local_5278;
  HighsLp *local_5270;
  allocator local_5261;
  string local_5260 [39];
  allocator local_5239;
  string local_5238 [48];
  HighsInfo *local_5208;
  undefined1 local_5200 [136];
  HighsLp *in_stack_ffffffffffffae88;
  undefined8 in_stack_ffffffffffffae90;
  int local_3c;
  int local_38;
  HighsStatus local_4;
  
  bVar10 = *(int *)(in_RDX + 0x200) != 0;
  for (local_38 = 0; local_38 < *in_RSI; local_38 = local_38 + 1) {
    addCol((HighsIis *)in_stack_ffffffffffffa690,
           (HighsInt)((ulong)in_stack_ffffffffffffa688 >> 0x20),(HighsInt)in_stack_ffffffffffffa688)
    ;
  }
  for (local_3c = 0; local_3c < in_RSI[1]; local_3c = local_3c + 1) {
    addRow((HighsIis *)in_stack_ffffffffffffa690,
           (HighsInt)((ulong)in_stack_ffffffffffffa688 >> 0x20),(HighsInt)in_stack_ffffffffffffa688)
    ;
  }
  Highs::Highs((Highs *)CONCAT44(in_stack_ffffffffffffa734,in_stack_ffffffffffffa730));
  local_5208 = Highs::getInfo((Highs *)local_5200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5238,"output_flag",&local_5239);
  Highs::setOptionValue
            (in_stack_ffffffffffffa698,(string *)in_stack_ffffffffffffa690,
             SUB81((ulong)in_stack_ffffffffffffa688 >> 0x38,0));
  std::__cxx11::string::~string(local_5238);
  std::allocator<char>::~allocator((allocator<char> *)&local_5239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5260,"presolve",&local_5261);
  Highs::setOptionValue
            (in_stack_ffffffffffffa748,
             (string *)CONCAT44(in_stack_ffffffffffffa744,in_stack_ffffffffffffa740),
             (string *)CONCAT44(in_stack_ffffffffffffa73c,in_stack_ffffffffffffa738));
  std::__cxx11::string::~string(local_5260);
  std::allocator<char>::~allocator((allocator<char> *)&local_5261);
  local_5270 = Highs::getLp((Highs *)local_5200);
  local_5278 = Highs::getBasis((Highs *)local_5200);
  local_5280 = Highs::getSolution((Highs *)local_5200);
  HighsLp::HighsLp((HighsLp *)CONCAT44(in_stack_ffffffffffffa714,in_stack_ffffffffffffa710),
                   (HighsLp *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708));
  HVar3 = Highs::passModel((Highs *)in_stack_ffffffffffffae90,in_stack_ffffffffffffae88);
  HighsLp::~HighsLp((HighsLp *)in_stack_ffffffffffffa690);
  local_5284 = HVar3;
  if (in_RCX != (string *)0x0) {
    in_stack_ffffffffffffa7d0 = local_5641;
    in_stack_ffffffffffffa7c8 = in_RCX;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_5641[0].alien,"",(allocator *)in_stack_ffffffffffffa7d0);
    Highs::setBasis((Highs *)CONCAT44(HVar3,in_stack_ffffffffffffa7d8),in_stack_ffffffffffffa7d0,
                    in_stack_ffffffffffffa7c8);
    std::__cxx11::string::~string((string *)&local_5641[0].alien);
    std::allocator<char>::~allocator((allocator<char> *)local_5641);
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x4cf178);
  local_5668 = 0.0;
  std::vector<double,_std::allocator<double>_>::assign
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa690,
             (size_type)in_stack_ffffffffffffa688,(value_type_conflict1 *)0x4cf1a4);
  iVar4 = *in_RSI + -1;
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x4cf1c6);
  local_5284 = Highs::changeColsCost
                         ((Highs *)CONCAT44(in_stack_ffffffffffffa7bc,iVar4),
                          (HighsInt)((ulong)in_stack_ffffffffffffa7b0 >> 0x20),
                          (HighsInt)in_stack_ffffffffffffa7b0,in_stack_ffffffffffffa7a8);
  if (in_RCX != (string *)0x0) {
    paVar13 = &local_5689;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5688,"",paVar13);
    Highs::setBasis((Highs *)CONCAT44(HVar3,in_stack_ffffffffffffa7d8),in_stack_ffffffffffffa7d0,
                    in_stack_ffffffffffffa7c8);
    std::__cxx11::string::~string(local_5688);
    std::allocator<char>::~allocator((allocator<char> *)&local_5689);
  }
  local_568a = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x4cf302);
  local_56a9 = false;
  local_56b0 = 0xffffffff;
  local_56b1 = kLower;
  local_5718 = local_5200;
  local_5710 = local_5208;
  local_5708._M_allocated_capacity = (size_type)&local_5284;
  local_5708._8_8_ = &local_56a9;
  local_56f8 = (pointer)&local_56b0;
  local_56f0 = &local_56b1;
  local_56e0 = local_5280;
  local_56c8 = local_5278;
  local_56d0 = local_56a8;
  local_5284 = compute::anon_class_96_12_a4261637::operator()(in_stack_ffffffffffffa6a8);
  if (local_5284 == kOk) {
    for (local_5720 = 0; local_5720 < 2; local_5720 = local_5720 + 1) {
      if ((bVar10) || (local_5869 = true, local_5720 != 0)) {
        local_586a = bVar10 && local_5720 == 1;
        local_5869 = local_586a;
      }
      local_56a9 = local_5869;
      if (local_5869 == false) {
        local_5878 = (HighsInt *)0x875329;
      }
      else {
        local_5878 = (HighsInt *)0x87482f;
      }
      paVar13 = &local_5741;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5740,(char *)local_5878,paVar13);
      std::allocator<char>::~allocator((allocator<char> *)&local_5741);
      if ((local_56a9 & 1U) == 0) {
        iVar4 = *in_RSI;
      }
      else {
        iVar4 = in_RSI[1];
      }
      local_5748 = iVar4;
      for (local_56b0 = 0; (int)local_56b0 < local_5748; local_56b0 = local_56b0 + 1) {
        if ((local_56a9 & 1U) == 0) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),
                              (long)(int)local_56b0);
          vVar12 = *pvVar5;
        }
        else {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),
                              (long)(int)local_56b0);
          vVar12 = *pvVar5;
        }
        local_574c = vVar12;
        if ((vVar12 != -1) && (vVar12 != 1)) {
          if ((local_56a9 & 1U) == 0) {
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RSI + 8),
                                (long)(int)local_56b0);
            value = (double *)*pvVar6;
          }
          else {
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x14),
                                (long)(int)local_56b0);
            value = (double *)*pvVar6;
          }
          local_5758 = value;
          if ((local_56a9 & 1U) == 0) {
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RSI + 0xe),
                                (long)(int)local_56b0);
            upper_00 = (double *)*pvVar6;
          }
          else {
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x1a),
                                (long)(int)local_56b0);
            upper_00 = (double *)*pvVar6;
          }
          local_5760 = upper_00;
          if (-INFINITY < (double)local_5758) {
            local_5761 = 1;
            HVar11 = (HighsInt)((ulong)in_stack_ffffffffffffa698 >> 0x20);
            if ((local_56a9 & 1U) == 0) {
              in_stack_ffffffffffffa754 =
                   Highs::changeColBounds
                             (in_stack_ffffffffffffa6a0,HVar11,(double)in_stack_ffffffffffffa690,
                              (double)in_stack_ffffffffffffa688);
              in_stack_ffffffffffffa758 = in_stack_ffffffffffffa754;
            }
            else {
              in_stack_ffffffffffffa75c =
                   Highs::changeRowBounds
                             (in_stack_ffffffffffffa6a0,HVar11,(double)in_stack_ffffffffffffa690,
                              (double)in_stack_ffffffffffffa688);
              in_stack_ffffffffffffa758 = in_stack_ffffffffffffa75c;
            }
            local_5284 = in_stack_ffffffffffffa758;
            in_stack_ffffffffffffa750 =
                 compute::anon_class_96_12_a4261637::operator()(in_stack_ffffffffffffa6a8);
            local_5284 = in_stack_ffffffffffffa750;
            if (in_stack_ffffffffffffa750 != kOk) {
              local_571c = 1;
              local_4 = in_stack_ffffffffffffa750;
              goto LAB_004d0015;
            }
            pHVar7 = Highs::getModelStatus((Highs *)local_5200);
            local_5768 = *pHVar7;
            if (local_5768 == kOptimal) {
              HVar11 = (HighsInt)((ulong)in_stack_ffffffffffffa698 >> 0x20);
              if ((local_56a9 & 1U) == 0) {
                in_stack_ffffffffffffa73c =
                     Highs::changeColBounds
                               (in_stack_ffffffffffffa6a0,HVar11,(double)in_stack_ffffffffffffa690,
                                (double)in_stack_ffffffffffffa688);
                in_stack_ffffffffffffa740 = in_stack_ffffffffffffa73c;
              }
              else {
                in_stack_ffffffffffffa744 =
                     Highs::changeRowBounds
                               (in_stack_ffffffffffffa6a0,HVar11,(double)in_stack_ffffffffffffa690,
                                (double)in_stack_ffffffffffffa688);
                in_stack_ffffffffffffa740 = in_stack_ffffffffffffa744;
              }
              local_5769 = 1;
              local_5284 = in_stack_ffffffffffffa740;
              if ((double)local_5760 < INFINITY) {
                local_5760 = (double *)0x7ff0000000000000;
                HVar11 = (HighsInt)((ulong)in_stack_ffffffffffffa698 >> 0x20);
                if ((local_56a9 & 1U) == 0) {
                  in_stack_ffffffffffffa730 =
                       Highs::changeColBounds
                                 (in_stack_ffffffffffffa6a0,HVar11,(double)in_stack_ffffffffffffa690
                                  ,(double)in_stack_ffffffffffffa688);
                  in_stack_ffffffffffffa734 = in_stack_ffffffffffffa730;
                  local_5284 = in_stack_ffffffffffffa730;
                }
                else {
                  in_stack_ffffffffffffa738 =
                       Highs::changeRowBounds
                                 (in_stack_ffffffffffffa6a0,HVar11,(double)in_stack_ffffffffffffa690
                                  ,(double)in_stack_ffffffffffffa688);
                  in_stack_ffffffffffffa734 = in_stack_ffffffffffffa738;
                  local_5284 = in_stack_ffffffffffffa738;
                }
              }
            }
            else {
              local_5758 = (double *)0xfff0000000000000;
            }
          }
          if ((double)local_5760 < INFINITY) {
            HVar11 = (HighsInt)((ulong)in_stack_ffffffffffffa698 >> 0x20);
            if ((local_56a9 & 1U) == 0) {
              in_stack_ffffffffffffa724 =
                   Highs::changeColBounds
                             (in_stack_ffffffffffffa6a0,HVar11,(double)in_stack_ffffffffffffa690,
                              (double)in_stack_ffffffffffffa688);
              in_stack_ffffffffffffa728 = in_stack_ffffffffffffa724;
            }
            else {
              in_stack_ffffffffffffa72c =
                   Highs::changeRowBounds
                             (in_stack_ffffffffffffa6a0,HVar11,(double)in_stack_ffffffffffffa690,
                              (double)in_stack_ffffffffffffa688);
              in_stack_ffffffffffffa728 = in_stack_ffffffffffffa72c;
            }
            local_5284 = in_stack_ffffffffffffa728;
            in_stack_ffffffffffffa720 =
                 compute::anon_class_96_12_a4261637::operator()(in_stack_ffffffffffffa6a8);
            HVar11 = (HighsInt)((ulong)in_stack_ffffffffffffa698 >> 0x20);
            local_5284 = in_stack_ffffffffffffa720;
            if (in_stack_ffffffffffffa720 != kOk) {
              local_571c = 1;
              local_4 = in_stack_ffffffffffffa720;
              goto LAB_004d0015;
            }
            in_stack_ffffffffffffa718 = (double *)Highs::getModelStatus((Highs *)local_5200);
            local_5770 = *(HighsModelStatus *)in_stack_ffffffffffffa718;
            if (local_5770 == kOptimal) {
              if ((local_56a9 & 1U) == 0) {
                local_5284 = Highs::changeColBounds
                                       (in_stack_ffffffffffffa6a0,HVar11,
                                        (double)in_stack_ffffffffffffa690,
                                        (double)in_stack_ffffffffffffa688);
              }
              else {
                local_5284 = Highs::changeRowBounds
                                       (in_stack_ffffffffffffa6a0,HVar11,
                                        (double)in_stack_ffffffffffffa690,
                                        (double)in_stack_ffffffffffffa688);
              }
            }
            else {
              local_5760 = (double *)0x7ff0000000000000;
            }
          }
          local_5771 = 1;
          if ((local_56a9 & 1U) == 0) {
            in_stack_ffffffffffffa690 = (Highs *)local_5798;
            in_stack_ffffffffffffa688 = local_5788;
            in_stack_ffffffffffffa6a8 = (anon_class_96_12_a4261637 *)0x0;
            in_stack_ffffffffffffa6a0 = (Highs *)0x0;
            in_stack_ffffffffffffa698 = (Highs *)0x0;
            local_58fc = Highs::getCols((Highs *)CONCAT44(in_stack_ffffffffffffa744,
                                                          in_stack_ffffffffffffa740),
                                        in_stack_ffffffffffffa73c,in_stack_ffffffffffffa738,
                                        (HighsInt *)
                                        CONCAT44(in_stack_ffffffffffffa734,in_stack_ffffffffffffa730
                                                ),
                                        (double *)
                                        CONCAT44(in_stack_ffffffffffffa72c,in_stack_ffffffffffffa728
                                                ),
                                        (double *)
                                        CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720
                                                ),upper_00,(HighsInt *)value,
                                        (HighsInt *)CONCAT44(iVar4,vVar12),local_5878,
                                        (double *)paVar13);
          }
          else {
            in_stack_ffffffffffffa688 = local_5798;
            in_stack_ffffffffffffa6a0 = (Highs *)0x0;
            in_stack_ffffffffffffa698 = (Highs *)0x0;
            in_stack_ffffffffffffa690 = (Highs *)0x0;
            local_58fc = Highs::getRows((Highs *)CONCAT44(in_stack_ffffffffffffa73c,
                                                          in_stack_ffffffffffffa738),
                                        in_stack_ffffffffffffa734,in_stack_ffffffffffffa730,
                                        (HighsInt *)
                                        CONCAT44(in_stack_ffffffffffffa72c,in_stack_ffffffffffffa728
                                                ),
                                        (double *)
                                        CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720
                                                ),in_stack_ffffffffffffa718,
                                        (HighsInt *)
                                        CONCAT44(in_stack_ffffffffffffa754,in_stack_ffffffffffffa750
                                                ),
                                        (HighsInt *)
                                        CONCAT44(in_stack_ffffffffffffa75c,in_stack_ffffffffffffa758
                                                ),(HighsInt *)upper_00,value);
          }
          local_5284 = local_58fc;
          if (-INFINITY < (double)local_5758) {
            if ((double)local_5760 < INFINITY) {
              local_579c = 4;
            }
            else {
              local_579c = 2;
            }
          }
          else if ((double)local_5760 < INFINITY) {
            local_579c = 3;
          }
          else if ((local_56a9 & 1U) == 0) {
            local_579c = 1;
          }
          else {
            local_579c = -1;
          }
          vVar12 = local_579c;
          if ((local_56a9 & 1U) == 0) {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),
                                (long)(int)local_56b0);
            *pvVar5 = vVar12;
          }
          else {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),
                                (long)(int)local_56b0);
            *pvVar5 = vVar12;
          }
          log_options_ = (HighsLogOptions *)(in_RDX + 0x380);
          this_00 = (HighsIis *)std::__cxx11::string::c_str();
          uVar2 = local_56b0;
          iisBoundStatusToString_abi_cxx11_(this_00,(HighsInt)((ulong)log_options_ >> 0x20));
          uVar8 = std::__cxx11::string::c_str();
          highsLogUser(log_options_,kInfo,"%s %d has status %s\n",this_00,(ulong)uVar2,uVar8);
          std::__cxx11::string::~string(local_57c0);
        }
      }
      if (local_5720 == 1) {
        local_571c = 10;
      }
      else {
        if ((local_56a9 & 1U) != 0) {
          for (local_57c4 = 0; (int)local_57c4 < *in_RSI; local_57c4 = local_57c4 + 1) {
            bVar1 = true;
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x24),
                                (long)(int)local_57c4);
            for (local_57cc = *pvVar9;
                pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x24),
                                    (long)(int)(local_57c4 + 1)), local_57cc < *pvVar9;
                local_57cc = local_57cc + 1) {
              pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x30),
                                  (long)local_57cc);
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),(long)*pvVar9
                                 );
              if (*pvVar5 != -1) {
                bVar1 = false;
                break;
              }
            }
            if (bVar1) {
              highsLogUser((HighsLogOptions *)(in_RDX + 0x380),kInfo,
                           "Col %d has status Dropped: Empty\n",(ulong)local_57c4);
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),
                                  (long)(int)local_57c4);
              *pvVar5 = -1;
              local_5284 = Highs::changeColBounds
                                     (in_stack_ffffffffffffa6a0,
                                      (HighsInt)((ulong)in_stack_ffffffffffffa698 >> 0x20),
                                      (double)in_stack_ffffffffffffa690,
                                      (double)in_stack_ffffffffffffa688);
            }
          }
        }
        local_571c = 0;
      }
LAB_004d0015:
      std::__cxx11::string::~string(local_5740);
      if ((local_571c != 0) && (local_571c != 10)) goto LAB_004d02f2;
    }
    local_57d0 = 0;
    for (local_57d4 = 0; local_57d4 < *in_RSI; local_57d4 = local_57d4 + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)local_57d4);
      if (*pvVar5 != -1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_57d4);
        vVar12 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_57d0);
        *pvVar5 = vVar12;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)local_57d4);
        vVar12 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)local_57d0);
        *pvVar5 = vVar12;
        local_57d0 = local_57d0 + 1;
      }
    }
    local_57d8 = 0;
    for (local_57dc = 0; local_57dc < in_RSI[1]; local_57dc = local_57dc + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),(long)local_57dc);
      if (*pvVar5 != -1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)local_57dc);
        vVar12 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)local_57d8);
        *pvVar5 = vVar12;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),(long)local_57dc);
        vVar12 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),(long)local_57d8);
        *pvVar5 = vVar12;
        local_57d8 = local_57d8 + 1;
      }
    }
    std::vector<int,_std::allocator<int>_>::resize
              (in_stack_ffffffffffffa6b0,(size_type)in_stack_ffffffffffffa6a8);
    std::vector<int,_std::allocator<int>_>::resize
              (in_stack_ffffffffffffa6b0,(size_type)in_stack_ffffffffffffa6a8);
    std::vector<int,_std::allocator<int>_>::resize
              (in_stack_ffffffffffffa6b0,(size_type)in_stack_ffffffffffffa6a8);
    std::vector<int,_std::allocator<int>_>::resize
              (in_stack_ffffffffffffa6b0,(size_type)in_stack_ffffffffffffa6a8);
    *in_RDI = 1;
    *(undefined4 *)(in_RDI + 4) = *(undefined4 *)(in_RDX + 0x200);
    local_4 = kOk;
    local_571c = 1;
  }
  else {
    local_571c = 1;
    local_4 = local_5284;
  }
LAB_004d02f2:
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa6a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa6a0);
  Highs::~Highs(in_stack_ffffffffffffa690);
  return local_4;
}

Assistant:

HighsStatus HighsIis::compute(const HighsLp& lp, const HighsOptions& options,
                              const HighsBasis* basis) {
  const HighsLogOptions& log_options = options.log_options;
  const bool row_priority =
      //      options.iis_strategy == kIisStrategyFromRayRowPriority ||
      options.iis_strategy == kIisStrategyFromLpRowPriority;
  // Initially all columns and rows are candidates for the IIS
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) this->addCol(iCol);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) this->addRow(iRow);
  Highs highs;
  const HighsInfo& info = highs.getInfo();
  highs.setOptionValue("output_flag", kIisDevReport);
  highs.setOptionValue("presolve", kHighsOffString);
  const HighsLp& incumbent_lp = highs.getLp();
  const HighsBasis& incumbent_basis = highs.getBasis();
  const HighsSolution& solution = highs.getSolution();
  HighsStatus run_status = highs.passModel(lp);
  assert(run_status == HighsStatus::kOk);
  if (basis) highs.setBasis(*basis);

  // Zero the objective
  std::vector<double> cost;
  cost.assign(lp.num_col_, 0);
  run_status = highs.changeColsCost(0, lp.num_col_ - 1, cost.data());
  assert(run_status == HighsStatus::kOk);
  // Solve the LP
  if (basis) highs.setBasis(*basis);
  const bool use_sensitivity_filter = false;
  std::vector<double> primal_phase1_dual;
  bool row_deletion = false;
  HighsInt iX = -1;
  bool drop_lower = false;

  // Lambda for gathering data when solving an LP
  auto solveLp = [&]() -> HighsStatus {
    HighsIisInfo iis_info;
    iis_info.simplex_time = -highs.getRunTime();
    iis_info.simplex_iterations = -info.simplex_iteration_count;
    run_status = highs.run();
    assert(run_status == HighsStatus::kOk);
    if (run_status != HighsStatus::kOk) return run_status;
    HighsModelStatus model_status = highs.getModelStatus();
    if (use_sensitivity_filter &&
        model_status == HighsModelStatus::kInfeasible) {
      printf("\nHighsIis::compute %s deletion for %d and %s bound\n",
             row_deletion ? "Row" : "Col", int(iX),
             drop_lower ? "Lower" : "Upper");
      bool output_flag;
      highs.getOptionValue("output_flag", output_flag);
      highs.setOptionValue("output_flag", true);
      HighsInt simplex_strategy;
      highs.getOptionValue("simplex_strategy", simplex_strategy);
      highs.setOptionValue("simplex_strategy", kSimplexStrategyPrimal);
      // Solve the LP
      run_status = highs.run();
      if (run_status != HighsStatus::kOk) return run_status;
      highs.writeSolution("", kSolutionStylePretty);
      const HighsInt* basic_index = highs.getBasicVariablesArray();
      std::vector<double> rhs;
      rhs.assign(lp.num_row_, 0);
      // Get duals for nonbasic rows, and initialise duals so that basic duals
      // are zero
      assert(101 == 202);

      for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
        HighsInt iVar = basic_index[iRow];
        const double lower = iVar < lp.num_col_
                                 ? lp.col_lower_[iVar]
                                 : lp.row_lower_[iVar - lp.num_col_];
        const double upper = iVar < lp.num_col_
                                 ? lp.col_upper_[iVar]
                                 : lp.row_upper_[iVar - lp.num_col_];
        const double value = iVar < lp.num_col_
                                 ? solution.col_value[iVar]
                                 : solution.row_value[iVar - lp.num_col_];
        if (value < lower - options.primal_feasibility_tolerance) {
          rhs[iRow] = -1;
        } else if (value > upper + options.primal_feasibility_tolerance) {
          rhs[iRow] = 1;
        }
      }
      HVector pi;
      pi.setup(lp.num_row_);
      highs.getBasisTransposeSolve(rhs.data(), &pi.array[0], NULL, NULL);
      pi.count = lp.num_row_;
      std::vector<double> reduced_costs_value;
      std::vector<HighsInt> reduced_costs_index;
      lp.a_matrix_.productTransposeQuad(reduced_costs_value,
                                        reduced_costs_index, pi);

      primal_phase1_dual = highs.getPrimalPhase1Dual();
      HighsInt num_zero_dual = 0;
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
        const HighsBasisStatus status = incumbent_basis.col_status[iCol];
        const double dual = primal_phase1_dual[iCol];
        const double lower = lp.col_lower_[iCol];
        const double upper = lp.col_upper_[iCol];
        const double value = solution.col_value[iCol];
        if (status != HighsBasisStatus::kBasic &&
            std::fabs(dual) < options.dual_feasibility_tolerance) {
          num_zero_dual++;
          // Small dual for nonbasic variable
          printf(
              "HighsIis::compute Column %d [%g, %g, %g] with status %s has "
              "dual %g\n",
              int(iCol), lower, value, upper,
              highs.basisStatusToString(status).c_str(), dual);
          //	  assert(123 == 456);
        }
      }
      for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
        const HighsBasisStatus status = incumbent_basis.row_status[iRow];
        const double dual = primal_phase1_dual[lp.num_col_ + iRow];
        const double lower = lp.row_lower_[iRow];
        const double upper = lp.row_upper_[iRow];
        const double value = solution.row_value[iRow];
        if (status != HighsBasisStatus::kBasic &&
            std::fabs(dual) < options.dual_feasibility_tolerance) {
          num_zero_dual++;
          // Small dual for nonbasic variable
          printf(
              "HighsIis::compute Row    %d [%g, %g, %g] with status %s has "
              "dual %g\n",
              int(iRow), lower, value, upper,
              highs.basisStatusToString(status).c_str(), dual);
          //	  assert(123 == 456);
        }
      }
      highs.setOptionValue("output_flag", output_flag);
      highs.setOptionValue("simplex_strategy", simplex_strategy);
      assert(!num_zero_dual);
    }
    iis_info.simplex_time += highs.getRunTime();
    iis_info.simplex_iterations += info.simplex_iteration_count;
    this->info_.push_back(iis_info);
    return run_status;
  };

  run_status = solveLp();
  if (run_status != HighsStatus::kOk) return run_status;

  assert(highs.getModelStatus() == HighsModelStatus::kInfeasible);

  // Pass twice: rows before columns, or columns before rows, according to
  // row_priority
  for (HighsInt k = 0; k < 2; k++) {
    row_deletion = (row_priority && k == 0) || (!row_priority && k == 1);
    std::string type = row_deletion ? "Row" : "Col";
    // Perform deletion pass
    HighsInt num_index = row_deletion ? lp.num_row_ : lp.num_col_;
    for (iX = 0; iX < num_index; iX++) {
      const HighsInt ix_status =
          row_deletion ? this->row_bound_[iX] : this->col_bound_[iX];
      if (ix_status == kIisBoundStatusDropped ||
          ix_status == kIisBoundStatusFree)
        continue;
      double lower = row_deletion ? lp.row_lower_[iX] : lp.col_lower_[iX];
      double upper = row_deletion ? lp.row_upper_[iX] : lp.col_upper_[iX];
      // Record whether the upper bound has been dropped due to the lower bound
      // being kept
      if (lower > -kHighsInf) {
        // Drop the lower bound temporarily
        bool drop_lower = true;
        run_status = row_deletion
                         ? highs.changeRowBounds(iX, -kHighsInf, upper)
                         : highs.changeColBounds(iX, -kHighsInf, upper);
        assert(run_status == HighsStatus::kOk);
        // Solve the LP
        run_status = solveLp();
        if (run_status != HighsStatus::kOk) return run_status;
        HighsModelStatus model_status = highs.getModelStatus();
        if (model_status == HighsModelStatus::kOptimal) {
          // Now feasible, so restore the lower bound
          run_status = row_deletion ? highs.changeRowBounds(iX, lower, upper)
                                    : highs.changeColBounds(iX, lower, upper);
          assert(run_status == HighsStatus::kOk);
          // If the lower bound must be kept, then any finite upper bound
          // must be dropped
          const bool apply_reciprocal_rule = true;
          if (apply_reciprocal_rule) {
            if (upper < kHighsInf) {
              // Drop the upper bound permanently
              upper = kHighsInf;
              run_status = row_deletion
                               ? highs.changeRowBounds(iX, lower, upper)
                               : highs.changeColBounds(iX, lower, upper);
              assert(run_status == HighsStatus::kOk);
            }
            assert(upper >= kHighsInf);
            // Since upper = kHighsInf, allow the loop to run so that
            // bound status is set as if upper were set to kHighsInf
            // by relaxing it and finding that the LP was still
            // infeasible
          }
        } else {
          // Bound can be dropped permanently
          assert(model_status == HighsModelStatus::kInfeasible);
          lower = -kHighsInf;
        }
      }
      if (upper < kHighsInf) {
        // Drop the upper bound temporarily
        run_status = row_deletion ? highs.changeRowBounds(iX, lower, kHighsInf)
                                  : highs.changeColBounds(iX, lower, kHighsInf);
        assert(run_status == HighsStatus::kOk);
        // Solve the LP
        run_status = solveLp();
        if (run_status != HighsStatus::kOk) return run_status;
        HighsModelStatus model_status = highs.getModelStatus();
        if (model_status == HighsModelStatus::kOptimal) {
          // Now feasible, so restore the upper bound
          run_status = row_deletion ? highs.changeRowBounds(iX, lower, upper)
                                    : highs.changeColBounds(iX, lower, upper);
          assert(run_status == HighsStatus::kOk);
        } else {
          // Bound can be dropped permanently
          assert(model_status == HighsModelStatus::kInfeasible);
          upper = kHighsInf;
        }
      }
      const bool debug_bound_change = true;
      if (debug_bound_change) {
        // Check bounds have been changed correctly
        double check_lower;
        double check_upper;
        double check_cost;
        HighsInt check_num_ix;
        HighsInt check_num_nz;
        run_status =
            row_deletion
                ? highs.getRows(iX, iX, check_num_ix, &check_lower,
                                &check_upper, check_num_nz, nullptr, nullptr,
                                nullptr)
                : highs.getCols(iX, iX, check_num_ix, &check_cost, &check_lower,
                                &check_upper, check_num_nz, nullptr, nullptr,
                                nullptr);
        assert(run_status == HighsStatus::kOk);
        assert(check_lower == lower);
        assert(check_upper == upper);
      }
      HighsInt iss_bound_status = kIisBoundStatusNull;
      if (lower <= -kHighsInf) {
        if (upper >= kHighsInf) {
          if (row_deletion) {
            // Free rows can be dropped
            iss_bound_status = kIisBoundStatusDropped;
          } else {
            // Free columns can only be dropped if they are empty
            iss_bound_status = kIisBoundStatusFree;
          }
        } else {
          iss_bound_status = kIisBoundStatusUpper;
        }
      } else {
        if (upper >= kHighsInf) {
          iss_bound_status = kIisBoundStatusLower;
        } else {
          // FX or BX: shouldn't happen
          iss_bound_status = kIisBoundStatusBoxed;
        }
      }
      assert(iss_bound_status != kIisBoundStatusNull);
      assert(iss_bound_status != kIisBoundStatusBoxed);
      if (row_deletion) {
        this->row_bound_[iX] = iss_bound_status;
      } else {
        this->col_bound_[iX] = iss_bound_status;
      }
      highsLogUser(log_options, HighsLogType::kInfo, "%s %d has status %s\n",
                   type.c_str(), int(iX),
                   iisBoundStatusToString(iss_bound_status).c_str());
    }
    if (k == 1) continue;
    // End of first pass: look to simplify second pass
    if (kIisDevReport) this->report("End of deletion", incumbent_lp);
    if (row_deletion) {
      // Mark empty columns as dropped
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
        bool empty_col = true;
        for (HighsInt iEl = lp.a_matrix_.start_[iCol];
             iEl < lp.a_matrix_.start_[iCol + 1]; iEl++) {
          if (this->row_bound_[lp.a_matrix_.index_[iEl]] !=
              kIisBoundStatusDropped) {
            empty_col = false;
            break;
          }
        }
        if (empty_col) {
          highsLogUser(log_options, HighsLogType::kInfo,
                       "Col %d has status Dropped: Empty\n", int(iCol));
          this->col_bound_[iCol] = kIisBoundStatusDropped;
          run_status = highs.changeColBounds(iCol, -kHighsInf, kHighsInf);
          assert(run_status == HighsStatus::kOk);
        }
      }
    }
    if (kIisDevReport) this->report("End of pass 1", incumbent_lp);
  }
  if (kIisDevReport) this->report("End of pass 2", incumbent_lp);
  HighsInt iss_num_col = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    if (this->col_bound_[iCol] != kIisBoundStatusDropped) {
      this->col_index_[iss_num_col] = this->col_index_[iCol];
      this->col_bound_[iss_num_col] = this->col_bound_[iCol];
      iss_num_col++;
    }
  }
  HighsInt iss_num_row = 0;
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (this->row_bound_[iRow] != kIisBoundStatusDropped) {
      this->row_index_[iss_num_row] = this->row_index_[iRow];
      this->row_bound_[iss_num_row] = this->row_bound_[iRow];
      iss_num_row++;
    }
  }
  this->col_index_.resize(iss_num_col);
  this->col_bound_.resize(iss_num_col);
  this->row_index_.resize(iss_num_row);
  this->row_bound_.resize(iss_num_row);
  this->valid_ = true;
  this->strategy_ = options.iis_strategy;
  return HighsStatus::kOk;
}